

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# porting.c
# Opt level: O0

int uni_mutex_new(uni_mutex_t *mutex)

{
  void *pvVar1;
  uni_mutex_t *mutex_local;
  
  if (mutex == (uni_mutex_t *)0x0) {
    mutex_local._4_4_ = -2;
  }
  else {
    pvVar1 = malloc(0x28);
    mutex->hdl = pvVar1;
    if (mutex->hdl == (void *)0x0) {
      mutex_local._4_4_ = -1;
    }
    else {
      pthread_mutex_init((pthread_mutex_t *)mutex->hdl,(pthread_mutexattr_t *)0x0);
      mutex_local._4_4_ = 0;
    }
  }
  return mutex_local._4_4_;
}

Assistant:

int uni_mutex_new(uni_mutex_t *mutex) {
    if (NULL_PTR_CHECK(mutex)) {
        return -INVALID_IN_PARAM;
    }

    mutex->hdl = malloc(sizeof(pthread_mutex_t));
    if (NULL_PTR_CHECK(mutex->hdl)) {
        return -OUT_OF_MEMORY;
    }

    pthread_mutex_init((pthread_mutex_t *)mutex->hdl, NULL);
    return OK;
}